

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiramHdiv.cpp
# Opt level: O1

void pzshape::TPZShapePiramHdiv::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int d;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  int local_45c;
  int local_444;
  double local_418;
  TPZFMatrix<double> local_3e0;
  double local_350 [21];
  TPZFMatrix<double> local_2a8;
  double local_218 [61];
  
  dVar15 = pt->fStore[2];
  local_418 = 0.0;
  if (ABS(dVar15 + -1.0) < 1e-12) {
    pt->fStore[2] = dVar15 + -1e-08;
    local_418 = dVar15;
  }
  local_3e0.fElem = local_350;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183e5a0;
  local_3e0.fSize = 0x14;
  local_3e0.fGiven = local_3e0.fElem;
  TPZVec<int>::TPZVec(&local_3e0.fPivot.super_TPZVec<int>,0);
  local_3e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3e0.fPivot.super_TPZVec<int>.fStore = local_3e0.fPivot.fExtAlloc;
  local_3e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3e0.fWork.fStore = (double *)0x0;
  local_3e0.fWork.fNElements = 0;
  local_3e0.fWork.fNAlloc = 0;
  local_3e0.fElem = (double *)0x0;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
  TPZFMatrix<double>::operator=(&local_3e0,phi);
  local_2a8.fElem = local_218;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183ef60;
  local_2a8.fSize = 0x3c;
  local_2a8.fGiven = local_2a8.fElem;
  TPZVec<int>::TPZVec(&local_2a8.fPivot.super_TPZVec<int>,0);
  local_2a8.fPivot.super_TPZVec<int>.fStore = local_2a8.fPivot.fExtAlloc;
  local_2a8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_2a8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_2a8.fWork.fStore = (double *)0x0;
  local_2a8.fWork.fNElements = 0;
  local_2a8.fWork.fNAlloc = 0;
  local_2a8.fElem = (double *)0x0;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183ec70;
  TPZFMatrix<double>::operator=(&local_2a8,dphi);
  TPZShapePiram::Shape(pt,id,order,&local_3e0,&local_2a8);
  dVar15 = 1.0 / (1.0 - pt->fStore[2]);
  uVar11 = 0;
  local_45c = 0;
  iVar3 = 0;
  do {
    if (uVar11 == 4) {
      local_45c = local_45c + 1;
    }
    else {
      if (uVar11 < 5) {
        local_444 = 2;
        uVar13 = 1;
      }
      else {
        uVar1 = TPZShapePiram::NConnectShapeF((int)uVar11,order->fStore[uVar11 - 5]);
        uVar13 = (ulong)uVar1;
        local_444 = NConnectShapeF((int)uVar11,order->fStore[uVar11 - 5]);
      }
      lVar4 = (long)local_45c;
      iVar12 = (int)uVar13;
      if (0 < iVar12) {
        lVar10 = lVar4 * 8;
        lVar14 = (long)iVar3 * 8;
        uVar8 = 0;
        do {
          lVar7 = uVar8 + lVar4;
          if (((lVar7 < 0) || (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7))
             || (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = uVar8 + (long)iVar3;
          if (((lVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar6] = local_3e0.fElem[lVar7];
          lVar9 = 0;
          do {
            if (((local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                (lVar7 < 0)) ||
               (local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) || (lVar6 < 0))
               || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(undefined8 *)
             ((long)dphi->fElem +
             lVar9 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar14) =
                 *(undefined8 *)
                  ((long)local_2a8.fElem +
                  lVar9 * 8 + local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar10);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 8;
          lVar14 = lVar14 + 8;
        } while (uVar8 != uVar13);
      }
      if (0 < iVar12 && iVar12 * 2 == local_444) {
        lVar10 = lVar4 * 8;
        uVar8 = 0;
        iVar5 = iVar12 + iVar3;
        do {
          lVar14 = uVar8 + lVar4;
          if (((lVar14 < 0) ||
              (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14)) ||
             (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          iVar2 = iVar12 + iVar3 + (int)uVar8;
          lVar7 = (long)iVar2;
          if (((iVar2 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar7] = local_3e0.fElem[lVar14] * dVar15;
          lVar6 = 0;
          do {
            if (((local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                (lVar14 < 0)) ||
               (local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) || (iVar2 < 0))
               || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar6 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * (long)iVar5 * 8)
                 = *(double *)
                    ((long)local_2a8.fElem +
                    lVar6 * 8 + local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar10)
                   * dVar15;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          if (((lVar14 < 0) ||
              (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14)) ||
             (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) || (iVar2 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar7 = lVar7 * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          dphi->fElem[lVar7 + 2] =
               local_3e0.fElem[lVar14] * dVar15 * dVar15 + dphi->fElem[lVar7 + 2];
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 8;
          iVar5 = iVar5 + 1;
        } while (uVar8 != uVar13);
      }
      local_45c = iVar12 + local_45c;
      iVar3 = iVar3 + local_444;
    }
    uVar11 = uVar11 + 1;
    if (uVar11 == 0x13) {
      if (ABS(local_418 + -1.0) < 1e-12) {
        pt->fStore[2] = local_418;
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_2a8,&PTR_PTR_0183ef28);
      TPZFMatrix<double>::~TPZFMatrix(&local_3e0,&PTR_PTR_0183e568);
      return;
    }
  } while( true );
}

Assistant:

void TPZShapePiramHdiv::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        
        REAL temp = 0.;
        if (IsZero(pt[2] - 1.)){
            temp = pt[2];
            pt[2] -= 1.e-8;
        }
        
        TPZFNMatrix<20,REAL> phicp(phi);
        TPZFNMatrix<60,REAL> dphicp(dphi);
        
        TPZShapePiram::Shape(pt, id, order, phicp, dphicp);
        
        REAL zst = 1./(1.-pt[2]);
        int count = 0;
        int countorig = 0;
        for (int is=0; is<NSides; is++) {
            if (is == 4) {
                countorig++;
                continue;
            }
            int norig = 1;
            int nshape = 2;
            if (is>4)
            {
                norig = TPZShapePiram::NConnectShapeF(is, order[is-5]);
                nshape = NConnectShapeF(is, order[is-5]);
            }
            for (int shape = 0; shape<norig; shape++)
            {
                phi(shape+count,0) = phicp(shape+countorig,0);
                for (int d=0; d<3; d++) {
                    dphi(d,shape+count) = dphicp(d,shape+countorig);
                }
            }
            if(norig*2 == nshape)
            {
                for (int shape = 0; shape<norig; shape++)
                {
                    phi(shape+norig+count,0) = phicp(shape+countorig,0)*zst;
                    for (int d=0; d<3; d++) {
                        dphi(d,shape+norig+count) = dphicp(d,shape+countorig)*zst;
                    }
                    dphi(2,shape+norig+count) += phicp(shape+countorig,0)*zst*zst;
                }
            }
            countorig+= norig;
            count += nshape;
        }
        if (IsZero(temp - 1.))
        {
            pt[2] = temp;
        }
    }